

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oaa.cc
# Opt level: O2

void predict_or_learn<true,false,false,false>(oaa *o,single_learner *base,example *ec)

{
  polyprediction *ppVar1;
  float fVar2;
  float fVar3;
  uint uVar4;
  ostream *poVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  uint32_t i_1;
  uint uVar9;
  ulong uVar10;
  stringstream outputStringStream;
  
  uVar4 = (ec->l).multi.label;
  fVar2 = (ec->l).simple.weight;
  if (((ulong)uVar4 == 0) || ((uVar4 != 0xffffffff && (o->k < (ulong)uVar4)))) {
    poVar5 = std::operator<<((ostream *)&std::cout,"label ");
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    poVar5 = std::operator<<(poVar5," is not in {1,");
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    poVar5 = std::operator<<(poVar5,"} This won\'t work right.");
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&outputStringStream);
  (ec->l).cs.costs._begin = (wclass *)0x7f7fffff;
  (ec->l).simple.initial = 0.0;
  LEARNER::learner<char,_example>::multipredict(base,ec,0,o->k,o->pred,true);
  uVar6 = o->k;
  uVar8 = 1;
  for (uVar7 = 2; uVar7 <= uVar6; uVar7 = uVar7 + 1) {
    fVar3 = o->pred[uVar7 - 1].scalar;
    ppVar1 = o->pred + (uVar8 - 1);
    uVar9 = uVar7;
    if (fVar3 < ppVar1->scalar || fVar3 == ppVar1->scalar) {
      uVar9 = uVar8;
    }
    uVar8 = uVar9;
  }
  if (ec->passthrough != (features *)0x0) {
    uVar7 = 0;
    while( true ) {
      uVar9 = uVar7 + 1;
      if (uVar6 < uVar9) break;
      add_passthrough_feature_magic(ec,0x398d4541,(ulong)uVar9,o->pred[uVar7].scalar);
      uVar6 = o->k;
      uVar7 = uVar9;
    }
  }
  uVar10 = 1;
  while (uVar7 = (uint)uVar10, uVar10 <= uVar6) {
    (ec->l).simple.label = *(float *)(&DAT_002359e0 + (ulong)(uVar4 == uVar7) * 4);
    *(undefined8 *)((long)&(ec->l).cs.costs._begin + 4) = 0;
    (ec->pred).scalar = o->pred[uVar7 - 1].scalar;
    LEARNER::learner<char,_example>::update(base,ec,(ulong)(uVar7 - 1));
    uVar6 = o->k;
    uVar10 = (ulong)(uVar7 + 1);
  }
  (ec->pred).multiclass = uVar8;
  (ec->l).multi.label = uVar4;
  (ec->l).simple.weight = fVar2;
  std::__cxx11::stringstream::~stringstream((stringstream *)&outputStringStream);
  return;
}

Assistant:

void predict_or_learn(oaa& o, LEARNER::single_learner& base, example& ec)
{
  MULTICLASS::label_t mc_label_data = ec.l.multi;
  if (mc_label_data.label == 0 || (mc_label_data.label > o.k && mc_label_data.label != (uint32_t)-1))
    cout << "label " << mc_label_data.label << " is not in {1," << o.k << "} This won't work right." << endl;

  stringstream outputStringStream;
  uint32_t prediction = 1;
  v_array<float> scores_array;
  if (scores)
    scores_array = ec.pred.scalars;

  ec.l.simple = {FLT_MAX, 0.f, 0.f};
  base.multipredict(ec, 0, o.k, o.pred, true);
  for (uint32_t i = 2; i <= o.k; i++)
    if (o.pred[i - 1].scalar > o.pred[prediction - 1].scalar)
      prediction = i;

  if (ec.passthrough)
    for (uint32_t i = 1; i <= o.k; i++) add_passthrough_feature(ec, i, o.pred[i - 1].scalar);

  if (is_learn)
  {
    for (uint32_t i = 1; i <= o.k; i++)
    {
      ec.l.simple = {(mc_label_data.label == i) ? 1.f : -1.f, 0.f, 0.f};
      ec.pred.scalar = o.pred[i - 1].scalar;
      base.update(ec, i - 1);
    }
  }

  if (print_all)
  {
    outputStringStream << "1:" << o.pred[0].scalar;
    for (uint32_t i = 2; i <= o.k; i++) outputStringStream << ' ' << i << ':' << o.pred[i - 1].scalar;
    o.all->print_text(o.all->raw_prediction, outputStringStream.str(), ec.tag);
  }

  if (scores)
  {
    scores_array.clear();
    for (uint32_t i = 0; i < o.k; i++) scores_array.push_back(o.pred[i].scalar);
    ec.pred.scalars = scores_array;

    if (probabilities)
    {
      float sum_prob = 0;
      for (uint32_t i = 0; i < o.k; i++)
      {
        ec.pred.scalars[i] = 1.f / (1.f + correctedExp(-o.pred[i].scalar));
        sum_prob += ec.pred.scalars[i];
      }
      float inv_sum_prob = 1.f / sum_prob;
      for (uint32_t i = 0; i < o.k; i++) ec.pred.scalars[i] *= inv_sum_prob;
    }
  }
  else
    ec.pred.multiclass = prediction;

  ec.l.multi = mc_label_data;
}